

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Statistics::print(Statistics *this,ostream *os)

{
  double dVar1;
  double dVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Da_25;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Db_25;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  avgDualDegeneracy;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  avgPrimalDegeneracy;
  cpp_dec_float<50U,_int,_void> vv;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  (*this->solvingTime->_vptr_Timer[6])();
  dVar1 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  (*this->readingTime->_vptr_Timer[6])();
  (*this->syncTime->_vptr_Timer[6])();
  (*this->transformTime->_vptr_Timer[6])();
  (*this->preprocessingTime->_vptr_Timer[6])();
  (*this->simplexTime->_vptr_Timer[6])();
  (*this->rationalTime->_vptr_Timer[6])();
  if ((long)this->iterationsPrimal < 1) {
    local_a8.fpclass = cpp_dec_float_finite;
    local_a8.prec_elem = 10;
    local_a8.data._M_elems[0] = 0;
    local_a8.data._M_elems[1] = 0;
    local_a8.data._M_elems[2] = 0;
    local_a8.data._M_elems[3] = 0;
    local_a8.data._M_elems[4] = 0;
    local_a8.data._M_elems[5] = 0;
    local_a8.data._M_elems._24_5_ = 0;
    local_a8.data._M_elems[7]._1_3_ = 0;
    local_a8.data._M_elems._32_5_ = 0;
    local_a8._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_a8,0.0);
  }
  else {
    local_a8.fpclass = cpp_dec_float_finite;
    local_a8.prec_elem = 10;
    local_a8.data._M_elems[0] = 0;
    local_a8.data._M_elems[1] = 0;
    local_a8.data._M_elems[2] = 0;
    local_a8.data._M_elems[3] = 0;
    local_a8.data._M_elems[4] = 0;
    local_a8.data._M_elems[5] = 0;
    local_a8.data._M_elems._24_5_ = 0;
    local_a8.data._M_elems[7]._1_3_ = 0;
    local_a8.data._M_elems._32_5_ = 0;
    local_a8._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_68,(long)this->iterationsPrimal,(type *)0x0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_a8,&(this->sumPrimalDegen).m_backend,&local_68);
  }
  iVar3 = this->iterations - this->iterationsPrimal;
  if (iVar3 == 0 || this->iterations < this->iterationsPrimal) {
    local_e8.fpclass = cpp_dec_float_finite;
    local_e8.prec_elem = 10;
    local_e8.data._M_elems[0] = 0;
    local_e8.data._M_elems[1] = 0;
    local_e8.data._M_elems[2] = 0;
    local_e8.data._M_elems[3] = 0;
    local_e8.data._M_elems[4] = 0;
    local_e8.data._M_elems[5] = 0;
    local_e8.data._M_elems._24_5_ = 0;
    local_e8.data._M_elems[7]._1_3_ = 0;
    local_e8.data._M_elems._32_5_ = 0;
    local_e8._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_e8,0.0);
  }
  else {
    local_e8.fpclass = cpp_dec_float_finite;
    local_e8.prec_elem = 10;
    local_e8.data._M_elems[0] = 0;
    local_e8.data._M_elems[1] = 0;
    local_e8.data._M_elems[2] = 0;
    local_e8.data._M_elems[3] = 0;
    local_e8.data._M_elems[4] = 0;
    local_e8.data._M_elems[5] = 0;
    local_e8.data._M_elems._24_5_ = 0;
    local_e8.data._M_elems[7]._1_3_ = 0;
    local_e8.data._M_elems._32_5_ = 0;
    local_e8._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_68,(long)iVar3,(type *)0x0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_e8,&(this->sumDualDegen).m_backend,&local_68);
  }
  lVar5 = *(long *)os;
  *(undefined8 *)(os + *(long *)(lVar5 + -0x18) + 8) = 2;
  lVar5 = *(long *)(lVar5 + -0x18);
  *(uint *)(os + lVar5 + 0x18) = *(uint *)(os + lVar5 + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(os,"Total time          : ",0x16);
  poVar4 = std::ostream::_M_insert<double>
                     ((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) + dVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Reading           : ",0x16);
  (*this->readingTime->_vptr_Timer[6])();
  poVar4 = std::ostream::_M_insert<double>
                     ((double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Solving           : ",0x16);
  poVar4 = std::ostream::_M_insert<double>(dVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Preprocessing     : ",0x16);
  (*this->preprocessingTime->_vptr_Timer[6])();
  std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
  if (dVar1 <= 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Simplex           : ",0x17);
    (*this->simplexTime->_vptr_Timer[6])();
    std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11));
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    (*this->preprocessingTime->_vptr_Timer[6])();
    poVar4 = std::ostream::_M_insert<double>
                       (((double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08) / dVar1) * 100.0)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% of solving time)",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Simplex           : ",0x17);
    (*this->simplexTime->_vptr_Timer[6])();
    std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09));
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    (*this->simplexTime->_vptr_Timer[6])();
    poVar4 = std::ostream::_M_insert<double>
                       (((double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10) / dVar1) * 100.0)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% of solving time)",0x12);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Synchronization   : ",0x17);
  (*this->syncTime->_vptr_Timer[6])();
  std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12));
  if (dVar1 <= 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Transformation    : ",0x17);
    (*this->transformTime->_vptr_Timer[6])();
    std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_16,extraout_XMM0_Da_16));
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    (*this->syncTime->_vptr_Timer[6])();
    poVar4 = std::ostream::_M_insert<double>
                       (((double)CONCAT44(extraout_XMM0_Db_13,extraout_XMM0_Da_13) / dVar1) * 100.0)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% of solving time)",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Transformation    : ",0x17);
    (*this->transformTime->_vptr_Timer[6])();
    std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_14,extraout_XMM0_Da_14));
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    (*this->transformTime->_vptr_Timer[6])();
    poVar4 = std::ostream::_M_insert<double>
                       (((double)CONCAT44(extraout_XMM0_Db_15,extraout_XMM0_Da_15) * 100.0) / dVar1)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% of solving time)",0x12);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Rational          : ",0x17);
  (*this->rationalTime->_vptr_Timer[6])();
  std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_17,extraout_XMM0_Da_17));
  if (0.0 < dVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    (*this->rationalTime->_vptr_Timer[6])();
    poVar4 = std::ostream::_M_insert<double>
                       (((double)CONCAT44(extraout_XMM0_Db_18,extraout_XMM0_Da_18) * 100.0) / dVar1)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% of solving time)",0x12);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  InitialPrecision  : ",0x17);
  (*this->initialPrecisionTime->_vptr_Timer[6])();
  std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_19,extraout_XMM0_Da_19));
  if (0.0 < dVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    (*this->initialPrecisionTime->_vptr_Timer[6])();
    poVar4 = std::ostream::_M_insert<double>
                       (((double)CONCAT44(extraout_XMM0_Db_20,extraout_XMM0_Da_20) * 100.0) / dVar1)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% of solving time)",0x12);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  ExtendedPrecision : ",0x17);
  (*this->extendedPrecisionTime->_vptr_Timer[6])();
  std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_21,extraout_XMM0_Da_21));
  if (0.0 < dVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    (*this->extendedPrecisionTime->_vptr_Timer[6])();
    poVar4 = std::ostream::_M_insert<double>
                       (((double)CONCAT44(extraout_XMM0_Db_22,extraout_XMM0_Da_22) * 100.0) / dVar1)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% of solving time)",0x12);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  BoostingStep      : ",0x17);
  (*this->boostingStepTime->_vptr_Timer[6])();
  std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_23,extraout_XMM0_Da_23));
  if (0.0 < dVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    (*this->boostingStepTime->_vptr_Timer[6])();
    poVar4 = std::ostream::_M_insert<double>
                       (((double)CONCAT44(extraout_XMM0_Db_24,extraout_XMM0_Da_24) * 100.0) / dVar1)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% of solving time)",0x12);
  }
  dVar2 = ((((dVar1 - (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01)) -
            (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02)) -
           (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03)) -
          (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04)) -
          (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  FpTime            : ",0x17);
  std::ostream::_M_insert<double>(this->fpTime);
  if (dVar1 <= 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Other             : ",0x17);
    std::ostream::_M_insert<double>(dVar2);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    poVar4 = std::ostream::_M_insert<double>((this->fpTime * 100.0) / dVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% of solving time)",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Other             : ",0x17);
    std::ostream::_M_insert<double>(dVar2);
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    poVar4 = std::ostream::_M_insert<double>((dVar2 * 100.0) / dVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% of solving time)",0x12);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\nRefinements         : ",0x17);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->refinements);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Stalling          : ",0x16);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,this->stallRefinements);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Pivoting          : ",0x16);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,this->pivotRefinements);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Feasibility       : ",0x16);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,this->feasRefinements);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Unboundedness     : ",0x16);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,this->unbdRefinements);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Precision boosts    : ",0x16);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->precBoosts);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Stalling          : ",0x16);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,this->stallPrecBoosts);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Pivoting          : ",0x16);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,this->pivotPrecBoosts);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Feasibility       : ",0x16);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,this->feasPrecBoosts);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Unboundedness     : ",0x16);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,this->unbdPrecBoosts);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Iterations          : ",0x16);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->iterations);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  From scratch      : ",0x16);
  std::ostream::operator<<((ostream *)poVar4,this->iterations - this->iterationsFromBasis);
  if (0 < this->iterations) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    poVar4 = std::ostream::_M_insert<double>
                       (((double)(this->iterations - this->iterationsFromBasis) * 100.0) /
                        (double)this->iterations);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"%)",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  From basis        : ",0x17);
  std::ostream::operator<<((ostream *)os,this->iterationsFromBasis);
  if (0 < this->iterations) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    poVar4 = std::ostream::_M_insert<double>
                       (((double)this->iterationsFromBasis * 100.0) / (double)this->iterations);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"%)",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Primal            : ",0x17);
  std::ostream::operator<<((ostream *)os,this->iterationsPrimal);
  if (0 < this->iterations) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    poVar4 = std::ostream::_M_insert<double>
                       (((double)this->iterationsPrimal * 100.0) / (double)this->iterations);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"%)",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Dual              : ",0x17);
  std::ostream::operator<<
            ((ostream *)os,this->iterations - (this->iterationsPrimal + this->iterationsPolish));
  if (0 < this->iterations) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    poVar4 = std::ostream::_M_insert<double>
                       (((double)(this->iterations - this->iterationsPrimal) * 100.0) /
                        (double)this->iterations);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"%)",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Bound flips       : ",0x17);
  std::ostream::operator<<((ostream *)os,this->boundflips);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Sol. polishing    : ",0x17);
  std::ostream::operator<<((ostream *)os,this->iterationsPolish);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  First FP solve    : ",0x17);
  std::ostream::operator<<((ostream *)os,this->iterationsFP);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\nIterationsBoosted   : ",0x17);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->boostedIterations);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  From scratch      : ",0x16);
  std::ostream::operator<<
            ((ostream *)poVar4,this->boostedIterations - this->boostedIterationsFromBasis);
  if (0 < this->boostedIterations) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    poVar4 = std::ostream::_M_insert<double>
                       (((double)(this->boostedIterations - this->boostedIterationsFromBasis) *
                        100.0) / (double)this->boostedIterations);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"%)",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  From basis        : ",0x17);
  std::ostream::operator<<((ostream *)os,this->boostedIterationsFromBasis);
  if (0 < this->boostedIterations) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    poVar4 = std::ostream::_M_insert<double>
                       (((double)this->boostedIterationsFromBasis * 100.0) /
                        (double)this->boostedIterations);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"%)",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Primal            : ",0x17);
  std::ostream::operator<<((ostream *)os,this->boostedIterationsPrimal);
  if (0 < this->boostedIterations) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    poVar4 = std::ostream::_M_insert<double>
                       (((double)this->boostedIterationsPrimal * 100.0) /
                        (double)this->boostedIterations);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"%)",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Dual              : ",0x17);
  std::ostream::operator<<
            ((ostream *)os,
             this->boostedIterations -
             (this->boostedIterationsPrimal + this->boostedIterationsPolish));
  if (0 < this->boostedIterations) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    poVar4 = std::ostream::_M_insert<double>
                       (((double)(this->boostedIterations - this->boostedIterationsPrimal) * 100.0)
                        / (double)this->boostedIterations);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"%)",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Bound flips       : ",0x17);
  std::ostream::operator<<((ostream *)os,this->boostedBoundflips);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Sol. polishing    : ",0x17);
  std::ostream::operator<<((ostream *)os,this->boostedIterationsPolish);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\nLU factorizations   : ",0x17);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->luFactorizationsReal);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Factor. frequency : ",0x16);
  if (this->luFactorizationsReal < 1) {
    pcVar6 = "-\n";
    lVar5 = 2;
    poVar4 = os;
  }
  else {
    poVar4 = std::ostream::_M_insert<double>
                       ((double)this->iterations / (double)this->luFactorizationsReal);
    pcVar6 = " iterations per factorization\n";
    lVar5 = 0x1e;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,lVar5);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  Factor. time      : ",0x16);
  poVar4 = std::ostream::_M_insert<double>(this->luFactorizationTimeReal);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"LU solves           : ",0x16);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->luSolvesReal);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Solve frequency   : ",0x16);
  if (this->iterations < 1) {
    pcVar6 = "-\n";
    lVar5 = 2;
    poVar4 = os;
  }
  else {
    poVar4 = std::ostream::_M_insert<double>((double)this->luSolvesReal / (double)this->iterations);
    pcVar6 = " solves per iteration\n";
    lVar5 = 0x16;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,lVar5);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  Solve time        : ",0x16);
  poVar4 = std::ostream::_M_insert<double>(this->luSolveTimeReal);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Matrix-Vector ops   : \n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  Sparse    time    : ",0x16);
  std::ostream::_M_insert<double>(this->multTimeSparse);
  if (0.0 < dVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    poVar4 = std::ostream::_M_insert<double>((this->multTimeSparse / dVar1) * 100.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% of solving time)",0x12);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n            calls   : ",0x17);
  std::ostream::operator<<((ostream *)os,this->multSparseCalls);
  std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
  poVar4 = std::ostream::_M_insert<double>
                     (((double)this->multSparseCalls / ((double)this->iterations + 0.01)) * 100.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% of iterations)",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Full      time    : ",0x17);
  std::ostream::_M_insert<double>(this->multTimeFull);
  if (0.0 < dVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    poVar4 = std::ostream::_M_insert<double>((this->multTimeFull / dVar1) * 100.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% of solving time)",0x12);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n            calls   : ",0x17);
  std::ostream::operator<<((ostream *)os,this->multFullCalls);
  std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
  poVar4 = std::ostream::_M_insert<double>
                     (((double)this->multFullCalls / ((double)this->iterations + 0.01)) * 100.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% of iterations)",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Colwise   time    : ",0x17);
  std::ostream::_M_insert<double>(this->multTimeColwise);
  if (0.0 < dVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    poVar4 = std::ostream::_M_insert<double>((this->multTimeColwise / dVar1) * 100.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% of solving time)",0x12);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n            calls   : ",0x17);
  std::ostream::operator<<((ostream *)os,this->multColwiseCalls);
  std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
  poVar4 = std::ostream::_M_insert<double>
                     (((double)this->multColwiseCalls / ((double)this->iterations + 0.01)) * 100.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% of iterations)",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Unsetup   time    : ",0x17);
  std::ostream::_M_insert<double>(this->multTimeUnsetup);
  if (0.0 < dVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    poVar4 = std::ostream::_M_insert<double>((this->multTimeUnsetup / dVar1) * 100.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% of solving time)",0x12);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n            calls   : ",0x17);
  std::ostream::operator<<((ostream *)os,this->multUnsetupCalls);
  std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
  poVar4 = std::ostream::_M_insert<double>
                     (((double)this->multUnsetupCalls / ((double)this->iterations + 0.01)) * 100.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% of iterations)",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Rat. factorizations : ",0x16);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->luFactorizationsRational);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Rat. factor. time : ",0x16);
  poVar4 = std::ostream::_M_insert<double>(this->luFactorizationTimeRational);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Rat. solve time   : ",0x16);
  poVar4 = std::ostream::_M_insert<double>(this->luSolveTimeRational);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Rat. reconstructions: ",0x16);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->rationalReconstructions);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Rat. rec. time    : ",0x16);
  (*this->reconstructionTime->_vptr_Timer[6])();
  poVar4 = std::ostream::_M_insert<double>
                     ((double)CONCAT44(extraout_XMM0_Db_25,extraout_XMM0_Da_25));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Degeneracy          : \n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  Primal Pivots     : ",0x16);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->degenPivotsPrimal);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  Dual Pivots       : ",0x16);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->degenPivotsDual);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  Primal Candidates : ",0x16);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->degenPivotCandPrimal);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  Dual Candidates   : ",0x16);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->degenPivotCandDual);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  Average Primal    : ",0x16);
  poVar4 = boost::multiprecision::operator<<
                     (os,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  Average Dual      : ",0x16);
  poVar4 = boost::multiprecision::operator<<
                     (os,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if (0 < this->iterationsInit) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Algorithm Iterations: ",0x16);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->callsReducedProb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Total             : ",0x16);
    poVar4 = (ostream *)
             std::ostream::operator<<((ostream *)os,this->iterationsRedProb + this->iterationsInit);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Initial           : ",0x16);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->iterationsInit);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Reduced Problem   : ",0x16);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->iterationsRedProb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Comp. Problem     : ",0x16);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->iterationsCompProb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(os,"Red. Problem Size   : \n",0x17);
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Rows              : ",0x16);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->numRedProbRows);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Columns           : ",0x16);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->numRedProbCols);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    lVar5 = *(long *)os;
    *(undefined8 *)(os + *(long *)(lVar5 + -0x18) + 8) = 0x10;
    *(uint *)(os + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(lVar5 + -0x18) + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(os + *(long *)(lVar5 + -0x18) + 8) = 2;
    *(uint *)(os + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(lVar5 + -0x18) + 0x18) & 0xfffffefb | 4;
    std::__ostream_insert<char,std::char_traits<char>>(os,"Red. Problem Status : ",0x16);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->redProbStatus);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(os,"Comp. Problem Status: ",0x16);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,this->compProbStatus);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    lVar5 = *(long *)os;
    *(undefined8 *)(os + *(long *)(lVar5 + -0x18) + 8) = 0x10;
    lVar5 = *(long *)(lVar5 + -0x18);
    *(uint *)(os + lVar5 + 0x18) = *(uint *)(os + lVar5 + 0x18) & 0xfffffefb | 0x100;
    std::__ostream_insert<char,std::char_traits<char>>(os,"Comp. Problem Obj.  : ",0x16);
    poVar4 = boost::multiprecision::operator<<(os,&this->finalCompObj);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  lVar5 = *(long *)os;
  *(undefined8 *)(os + *(long *)(lVar5 + -0x18) + 8) = 8;
  lVar5 = *(long *)(lVar5 + -0x18);
  *(uint *)(os + lVar5 + 0x18) = *(uint *)(os + lVar5 + 0x18) & 0xfffffefb | 0x100;
  std::__ostream_insert<char,std::char_traits<char>>(os,"Numerics            :\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  Condition Number  : ",0x16);
  poVar4 = boost::multiprecision::operator<<(os,&this->finalBasisCondition);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  return;
}

Assistant:

void SoPlexBase<R>::Statistics::print(std::ostream& os)
{
   Real solTime = solvingTime->time();
   Real totTime = readingTime->time() + solTime;
   Real otherTime = solTime - syncTime->time() - transformTime->time() - preprocessingTime->time() -
                    simplexTime->time() - rationalTime->time();

   R avgPrimalDegeneracy = iterationsPrimal > 0 ? sumPrimalDegen / iterationsPrimal : 0.0;
   R avgDualDegeneracy = (iterations - iterationsPrimal) > 0 ?
                         (sumDualDegen / (iterations - iterationsPrimal)) : 0.0;

   SPxOut::setFixed(os, 2);

   os << "Total time          : " << totTime << "\n"
      << "  Reading           : " << readingTime->time() << "\n"
      << "  Solving           : " << solTime << "\n"
      << "  Preprocessing     : " << preprocessingTime->time();

   if(solTime > 0)
      os << " (" << 100 * (preprocessingTime->time() / solTime) << "% of solving time)";

   os << "\n  Simplex           : " << simplexTime->time();

   if(solTime > 0)
      os << " (" << 100 * (simplexTime->time() / solTime) << "% of solving time)";

   os << "\n  Synchronization   : " << syncTime->time();

   if(solTime > 0)
      os << " (" << 100 * (syncTime->time() / solTime) << "% of solving time)";

   os << "\n  Transformation    : " << transformTime->time();

   if(solTime > 0)
      os << " (" << 100 * transformTime->time() / solTime << "% of solving time)";

   os << "\n  Rational          : " << rationalTime->time();

   if(solTime > 0)
      os << " (" << 100 * rationalTime->time() / solTime << "% of solving time)";

   os << "\n  InitialPrecision  : " << initialPrecisionTime->time();

   if(solTime > 0)
      os << " (" << 100 * initialPrecisionTime->time() / solTime << "% of solving time)";

   os << "\n  ExtendedPrecision : " << extendedPrecisionTime->time();

   if(solTime > 0)
      os << " (" << 100 * extendedPrecisionTime->time() / solTime << "% of solving time)";

   os << "\n  BoostingStep      : " << boostingStepTime->time();

   if(solTime > 0)
      os << " (" << 100 * boostingStepTime->time() / solTime << "% of solving time)";

   os << "\n  FpTime            : " << fpTime;

   if(solTime > 0)
      os << " (" << 100 * fpTime / solTime << "% of solving time)";

   os << "\n  Other             : " << otherTime;

   if(solTime > 0)
      os << " (" << 100 * otherTime / solTime << "% of solving time)";

   os << "\nRefinements         : " << refinements << "\n"
      << "  Stalling          : " << stallRefinements << "\n"
      << "  Pivoting          : " << pivotRefinements << "\n"
      << "  Feasibility       : " << feasRefinements << "\n"
      << "  Unboundedness     : " << unbdRefinements << "\n";

   os << "Precision boosts    : " << precBoosts << "\n"
      << "  Stalling          : " << stallPrecBoosts << "\n"
      << "  Pivoting          : " << pivotPrecBoosts << "\n"
      << "  Feasibility       : " << feasPrecBoosts << "\n"
      << "  Unboundedness     : " << unbdPrecBoosts << "\n";

   os << "Iterations          : " << iterations << "\n"
      << "  From scratch      : " << iterations - iterationsFromBasis;

   if(iterations > 0)
      os << " (" << 100 * double((iterations - iterationsFromBasis)) / double(iterations) << "%)";

   os << "\n  From basis        : " << iterationsFromBasis;

   if(iterations > 0)
      os << " (" << 100 * double(iterationsFromBasis) / double(iterations) << "%)";

   os << "\n  Primal            : " << iterationsPrimal;

   if(iterations > 0)
      os << " (" << 100 * double(iterationsPrimal) / double(iterations) << "%)";

   os << "\n  Dual              : " << iterations - iterationsPrimal - iterationsPolish;

   if(iterations > 0)
      os << " (" << 100 * double((iterations - iterationsPrimal)) / double(iterations) << "%)";

   os << "\n  Bound flips       : " << boundflips;
   os << "\n  Sol. polishing    : " << iterationsPolish;
   os << "\n  First FP solve    : " << iterationsFP;

   os << "\nIterationsBoosted   : " << boostedIterations << "\n"
      << "  From scratch      : " << int(boostedIterations - boostedIterationsFromBasis);

   if(boostedIterations > 0)
      os << " (" << 100 * double((boostedIterations - boostedIterationsFromBasis)) / double(
            boostedIterations) << "%)";

   os << "\n  From basis        : " << boostedIterationsFromBasis;

   if(boostedIterations > 0)
      os << " (" << 100 * double(boostedIterationsFromBasis) / double(boostedIterations) << "%)";

   os << "\n  Primal            : " << boostedIterationsPrimal;

   if(boostedIterations > 0)
      os << " (" << 100 * double(boostedIterationsPrimal) / double(boostedIterations) << "%)";

   os << "\n  Dual              : " << boostedIterations - boostedIterationsPrimal -
      boostedIterationsPolish;

   if(boostedIterations > 0)
      os << " (" << 100 * double((boostedIterations - boostedIterationsPrimal)) / double(
            boostedIterations) << "%)";

   os << "\n  Bound flips       : " << boostedBoundflips;
   os << "\n  Sol. polishing    : " << boostedIterationsPolish;

   os << "\nLU factorizations   : " << luFactorizationsReal << "\n"
      << "  Factor. frequency : ";

   if(luFactorizationsReal > 0)
      os << double(iterations) / double(luFactorizationsReal) << " iterations per factorization\n";
   else
      os << "-\n";

   os << "  Factor. time      : " << luFactorizationTimeReal << "\n";

   os << "LU solves           : " << luSolvesReal << "\n"
      << "  Solve frequency   : ";

   if(iterations > 0)
      os << double(luSolvesReal) / double(iterations) << " solves per iteration\n";
   else
      os << "-\n";

   os << "  Solve time        : " << luSolveTimeReal << "\n";

   os << "Matrix-Vector ops   : \n"
      << "  Sparse    time    : " << multTimeSparse;

   if(solTime > 0)
      os << " (" << 100 * (multTimeSparse / solTime) << "% of solving time)";

   os << "\n            calls   : " << multSparseCalls;
   os << " (" << 100 * (multSparseCalls / (0.01 + iterations)) << "% of iterations)";
   os << "\n  Full      time    : " << multTimeFull;

   if(solTime > 0)
      os << " (" << 100 * (multTimeFull / solTime) << "% of solving time)";

   os << "\n            calls   : " << multFullCalls;
   os << " (" << 100 * (multFullCalls / (0.01 + iterations)) << "% of iterations)";
   os << "\n  Colwise   time    : " << multTimeColwise;

   if(solTime > 0)
      os << " (" << 100 * (multTimeColwise / solTime) << "% of solving time)";

   os << "\n            calls   : " << multColwiseCalls;
   os << " (" << 100 * (multColwiseCalls / (0.01 + iterations)) << "% of iterations)";
   os << "\n  Unsetup   time    : " << multTimeUnsetup;

   if(solTime > 0)
      os << " (" << 100 * (multTimeUnsetup / solTime) << "% of solving time)";

   os << "\n            calls   : " << multUnsetupCalls;
   os << " (" << 100 * (multUnsetupCalls / (0.01 + iterations)) << "% of iterations)";
   os << "\n";

   os << "Rat. factorizations : " << luFactorizationsRational << "\n"
      << "  Rat. factor. time : " << luFactorizationTimeRational << "\n"
      << "  Rat. solve time   : " << luSolveTimeRational << "\n";

   os << "Rat. reconstructions: " << rationalReconstructions << "\n"
      << "  Rat. rec. time    : " << reconstructionTime->time() << "\n";

   os << "Degeneracy          : \n";
   os << "  Primal Pivots     : " << degenPivotsPrimal << "\n";
   os << "  Dual Pivots       : " << degenPivotsDual << "\n";
   os << "  Primal Candidates : " << degenPivotCandPrimal << "\n";
   os << "  Dual Candidates   : " << degenPivotCandDual << "\n";
   os << "  Average Primal    : " << avgPrimalDegeneracy << "\n";
   os << "  Average Dual      : " << avgDualDegeneracy << "\n";

   if(iterationsInit > 0)
   {
      os << "Algorithm Iterations: " << callsReducedProb << "\n";
      os << "  Total             : " << iterationsInit + iterationsRedProb << "\n";
      os << "  Initial           : " << iterationsInit << "\n";
      os << "  Reduced Problem   : " << iterationsRedProb << "\n";
      os << "  Comp. Problem     : " << iterationsCompProb << "\n";
      os << "Red. Problem Size   : \n";
      os << "  Rows              : " << numRedProbRows << "\n";
      os << "  Columns           : " << numRedProbCols << "\n";

      SPxOut::setScientific(os, 16);

      SPxOut::setFixed(os, 2);

      os << "Red. Problem Status : " << redProbStatus << "\n";
      os << "Comp. Problem Status: " << compProbStatus << "\n";

      SPxOut::setScientific(os, 16);

      os << "Comp. Problem Obj.  : " << finalCompObj << "\n";
   }

   SPxOut::setScientific(os);

   os << "Numerics            :\n";
   os << "  Condition Number  : " << finalBasisCondition << "\n";

}